

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStepInnerStepper_Reset(MRIStepInnerStepper stepper,sunrealtype tR,N_Vector yR)

{
  MRIStepInnerResetFn p_Var1;
  int iVar2;
  
  iVar2 = -0x16;
  if ((stepper != (MRIStepInnerStepper)0x0) && (stepper->ops != (MRIStepInnerStepper_Ops)0x0)) {
    p_Var1 = stepper->ops->reset;
    if (p_Var1 == (MRIStepInnerResetFn)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*p_Var1)(stepper,tR,yR);
      stepper->last_flag = iVar2;
    }
  }
  return iVar2;
}

Assistant:

int mriStepInnerStepper_Reset(MRIStepInnerStepper stepper, sunrealtype tR,
                              N_Vector yR)
{
  if (stepper == NULL) { return ARK_ILL_INPUT; }
  if (stepper->ops == NULL) { return ARK_ILL_INPUT; }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(stepper->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "ARKODE::mriStepInnerStepper_Reset", "reset-inner-state",
                     "tR = %" RSYM, tR);
#endif

  if (stepper->ops->reset)
  {
    stepper->last_flag = stepper->ops->reset(stepper, tR, yR);
    return stepper->last_flag;
  }
  else
  {
    /* assume stepper uses input state and does not need to be reset */
    return ARK_SUCCESS;
  }
}